

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

void save_food(memfile *mf)

{
  uint value;
  uint uVar1;
  
  value = 0;
  uVar1 = 0;
  if (victual.piece != (obj *)0x0) {
    uVar1 = (victual.piece)->o_id;
  }
  mwrite32(mf,uVar1);
  mwrite32(mf,victual.usedtime);
  mwrite32(mf,victual.reqtime);
  mwrite32(mf,victual.nmod);
  uVar1 = (uint)(byte)victual._20_1_ * 0x40000000 + ((byte)victual._20_1_ & 0xc) * 0x4000000;
  mwrite32(mf,(uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2);
  if (tin.tin != (obj *)0x0) {
    value = (tin.tin)->o_id;
  }
  mwrite32(mf,value);
  mwrite32(mf,tin.usedtime);
  mwrite32(mf,tin.reqtime);
  return;
}

Assistant:

void save_food(struct memfile *mf)
{
    unsigned int oid, vflags;

    /* no mtag useful; fixed distance after track */

    oid = victual.piece ? victual.piece->o_id : 0;
    mwrite32(mf, oid);
    mwrite32(mf, victual.usedtime);
    mwrite32(mf, victual.reqtime);
    mwrite32(mf, victual.nmod);

    vflags = (victual.canchoke << 31) | (victual.fullwarn << 30) |
             (victual.eating << 29) | (victual.doreset << 28);
    mwrite32(mf, vflags);

    oid = tin.tin ? tin.tin->o_id : 0;
    mwrite32(mf, oid);
    mwrite32(mf, tin.usedtime);
    mwrite32(mf, tin.reqtime);
}